

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::Destroy(DBaseStatusBar *this)

{
  DHUDMessage *pDVar1;
  DHUDMessage *next;
  DHUDMessage *msg;
  size_t i;
  DBaseStatusBar *this_local;
  
  for (msg = (DHUDMessage *)0x0; msg < (DHUDMessage *)0x3;
      msg = (DHUDMessage *)((long)&(msg->super_DObject)._vptr_DObject + 1)) {
    next = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(this->Messages + (long)msg));
    while (next != (DHUDMessage *)0x0) {
      pDVar1 = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)&next->Next);
      (*(next->super_DObject)._vptr_DObject[4])();
      next = pDVar1;
    }
    TObjPtr<DHUDMessage>::operator=(this->Messages + (long)msg,(DHUDMessage *)0x0);
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DBaseStatusBar::Destroy ()
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *msg = Messages[i];
		while (msg)
		{
			DHUDMessage *next = msg->Next;
			msg->Destroy();
			msg = next;
		}
		Messages[i] = NULL;
	}
	Super::Destroy();
}